

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Output.cxx
# Opt level: O2

void __thiscall
Fl_Value_Output::Fl_Value_Output(Fl_Value_Output *this,int X,int Y,int W,int H,char *l)

{
  Fl_Valuator::Fl_Valuator(&this->super_Fl_Valuator,X,Y,W,H,l);
  (this->super_Fl_Valuator).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Widget_00279dd8
  ;
  (this->super_Fl_Valuator).super_Fl_Widget.box_ = '\0';
  (this->super_Fl_Valuator).super_Fl_Widget.label_.align_ = 4;
  *(undefined4 *)&(this->super_Fl_Valuator).field_0xa4 = 0;
  this->textsize_ = FL_NORMAL_SIZE;
  this->textcolor_ = 0;
  this->soft_ = '\0';
  return;
}

Assistant:

Fl_Value_Output::Fl_Value_Output(int X, int Y, int W, int H,const char *l)
: Fl_Valuator(X,Y,W,H,l) {
  box(FL_NO_BOX);
  align(FL_ALIGN_LEFT);
  textfont_ = FL_HELVETICA;
  textsize_ = FL_NORMAL_SIZE;
  textcolor_ = FL_FOREGROUND_COLOR;
  soft_ = 0;
}